

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int ac_thr_factor(int speed,int width,int height,int norm_sum)

{
  int norm_sum_local;
  int height_local;
  int width_local;
  int speed_local;
  undefined4 local_4;
  
  if ((speed < 8) || (4 < norm_sum)) {
    local_4 = 1;
  }
  else if ((width < 0x281) && (height < 0x1e1)) {
    local_4 = 4;
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int ac_thr_factor(int speed, int width, int height, int norm_sum) {
  if (speed >= 8 && norm_sum < 5) {
    if (width <= 640 && height <= 480)
      return 4;
    else
      return 2;
  }
  return 1;
}